

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * __thiscall
cmSystemTools::HelpFileName_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,string_view str)

{
  allocator<char> local_22;
  undefined1 local_21;
  undefined1 local_20 [8];
  string_view str_local;
  string *name;
  
  str_local._M_len = str._M_len;
  local_21 = 0;
  local_20 = (undefined1  [8])this;
  str_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_22);
  std::allocator<char>::~allocator(&local_22);
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"<","");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,">","");
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::HelpFileName(cm::string_view str)
{
  std::string name(str);
  cmSystemTools::ReplaceString(name, "<", "");
  cmSystemTools::ReplaceString(name, ">", "");
  return name;
}